

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

bool ImGui::DragBehaviorT<unsigned_int,int,float>
               (ImGuiDataType data_type,uint *v,float v_speed,uint v_min,uint v_max,char *format,
               float power,ImGuiDragFlags flags)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  undefined8 uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  ImGuiContext *pIVar9;
  bool bVar10;
  ImGuiInputSource IVar11;
  uint uVar12;
  uint uVar13;
  int iVar14;
  uint uVar15;
  bool bVar16;
  float fVar17;
  float fVar18;
  undefined1 auVar19 [16];
  undefined4 in_XMM0_Db;
  undefined4 in_XMM0_Dc;
  undefined4 in_XMM0_Dd;
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 in_ZMM2 [64];
  undefined4 in_XMM4_Da;
  undefined1 in_register_00001304 [12];
  float local_8c;
  undefined1 local_68 [16];
  undefined8 local_50;
  undefined1 local_48 [16];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [56];
  
  pIVar9 = GImGui;
  uVar13 = data_type & 0xfffffffe;
  bVar16 = uVar13 != 8;
  bVar2 = v_max <= v_min;
  bVar3 = power == 1.0;
  if (v_max < v_min) {
    return false;
  }
  if (v_speed == 0.0 && (v_min <= v_max && v_max - v_min != 0)) {
    auVar19 = vcvtusi2ss_avx512f(in_ZMM2._0_16_,v_max - v_min);
    v_speed = auVar19._0_4_ * GImGui->DragSpeedDefaultRatio;
    in_XMM0_Db = 0;
    in_XMM0_Dc = 0;
    in_XMM0_Dd = 0;
  }
  IVar11 = GImGui->ActiveIdSource;
  uVar15 = flags & 1;
  local_68._4_4_ = in_XMM0_Db;
  local_68._0_4_ = v_speed;
  local_68._8_4_ = in_XMM0_Dc;
  local_68._12_4_ = in_XMM0_Dd;
  if (IVar11 == ImGuiInputSource_Mouse) {
    bVar10 = IsMousePosValid((ImVec2 *)0x0);
    if ((!bVar10) || ((pIVar9->IO).MouseDragMaxDistanceSqr[0] <= 1.0)) {
      IVar11 = pIVar9->ActiveIdSource;
      goto LAB_0021f4e1;
    }
    fVar17 = (pIVar9->IO).NavInputs[(ulong)uVar15 + 0x1d];
    bVar10 = (pIVar9->IO).KeyShift;
    bVar1 = (pIVar9->IO).KeyAlt;
    fVar17 = (float)((uint)(bVar1 & 1) * (int)(fVar17 * 0.01) +
                    (uint)!(bool)(bVar1 & 1) * (int)fVar17);
    fVar17 = (float)((uint)(bVar10 & 1) * (int)(fVar17 * 10.0) +
                    (uint)!(bool)(bVar10 & 1) * (int)fVar17);
  }
  else {
LAB_0021f4e1:
    fVar17 = 0.0;
    if (IVar11 == ImGuiInputSource_Nav) {
      iVar14 = 0;
      if (uVar13 == 8) {
        iVar14 = ImParseFormatPrecision(format,3);
      }
      auVar20._0_8_ = GetNavInputAmount2d(3,ImGuiInputReadMode_RepeatFast,0.1,10.0);
      auVar20._8_56_ = extraout_var_00;
      local_50 = vmovlps_avx(auVar20._0_16_);
      local_48 = ZEXT416(*(uint *)(local_48 + (ulong)uVar15 * 4 + -8));
      auVar21._0_4_ = GetMinimumStepAtDecimalPrecision(iVar14);
      auVar21._4_60_ = extraout_var;
      uVar4 = vcmpss_avx512f(auVar21._0_16_,local_68,2);
      bVar10 = (bool)((byte)uVar4 & 1);
      v_speed = (float)((uint)bVar10 * (int)v_speed + (uint)!bVar10 * (int)auVar21._0_4_);
      fVar17 = (float)local_48._0_4_;
    }
  }
  fVar17 = fVar17 * v_speed;
  auVar19._8_4_ = 0x80000000;
  auVar19._0_8_ = 0x8000000080000000;
  auVar19._12_4_ = 0x80000000;
  auVar19 = vxorps_avx512vl(ZEXT416((uint)fVar17),auVar19);
  iVar14 = v_max - v_min;
  fVar18 = (float)((uint)(uVar15 == 0) * (int)fVar17 + (uint)(uVar15 != 0) * auVar19._0_4_);
  if (v_max < v_min || iVar14 == 0) {
    bVar10 = false;
LAB_0021f5dc:
    bVar1 = false;
  }
  else {
    if ((*v < v_max) || (bVar10 = true, fVar18 <= 0.0)) {
      bVar10 = fVar18 < 0.0 && *v <= v_min;
    }
    if ((bVar2 || bVar16) || bVar3) goto LAB_0021f5dc;
    if ((fVar18 < 0.0) && (0.0 < pIVar9->DragCurrentAccum)) goto LAB_0021f60f;
    if (fVar18 <= 0.0) goto LAB_0021f5dc;
    bVar1 = pIVar9->DragCurrentAccum < 0.0;
  }
  if (((pIVar9->ActiveIdIsJustActivated == false) && (!bVar10)) && (!bVar1)) {
    if ((fVar17 != 0.0) || (NAN(fVar17))) {
      pIVar9->DragCurrentAccum = fVar18 + pIVar9->DragCurrentAccum;
      pIVar9->DragCurrentAccumDirty = true;
    }
    else if ((pIVar9->DragCurrentAccumDirty & 1U) == 0) {
      return false;
    }
    if ((bVar2 || bVar16) || bVar3) {
      local_8c = 0.0;
      uVar15 = *v + (int)pIVar9->DragCurrentAccum;
    }
    else {
      auVar5._4_12_ = in_register_00001304;
      auVar5._0_4_ = in_XMM4_Da;
      auVar19 = vcvtusi2ss_avx512f(auVar5,*v - v_min);
      auVar6._4_12_ = in_register_00001304;
      auVar6._0_4_ = in_XMM4_Da;
      auVar5 = vcvtusi2ss_avx512f(auVar6,iVar14);
      local_8c = powf(auVar19._0_4_ / auVar5._0_4_,1.0 / power);
      auVar19 = ZEXT416((uint)(local_8c + pIVar9->DragCurrentAccum / auVar5._0_4_));
      uVar4 = vcmpss_avx512f(auVar19,ZEXT816(0) << 0x40,1);
      auVar19 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar19);
      fVar17 = powf((float)((uint)!(bool)((byte)uVar4 & 1) * auVar19._0_4_),power);
      uVar15 = (int)fVar17 * iVar14 + v_min;
    }
    uVar15 = RoundScalarWithFormatT<unsigned_int,int>(format,data_type,uVar15);
    pIVar9->DragCurrentAccumDirty = false;
    if ((bVar2 || bVar16) || bVar3) {
      uVar12 = *v;
      pIVar9->DragCurrentAccum = pIVar9->DragCurrentAccum - (float)(int)(uVar15 - uVar12);
    }
    else {
      auVar7._4_12_ = in_register_00001304;
      auVar7._0_4_ = in_XMM4_Da;
      auVar19 = vcvtusi2ss_avx512f(auVar7,uVar15 - v_min);
      auVar8._4_12_ = in_register_00001304;
      auVar8._0_4_ = in_XMM4_Da;
      auVar5 = vcvtusi2ss_avx512f(auVar8,iVar14);
      fVar17 = powf(auVar19._0_4_ / auVar5._0_4_,1.0 / power);
      pIVar9->DragCurrentAccum = pIVar9->DragCurrentAccum - (fVar17 - local_8c);
      uVar12 = *v;
    }
    if ((v_min < v_max) && (uVar12 != uVar15)) {
      if ((uVar15 < v_min) || (((uVar13 != 8 && (uVar12 < uVar15)) && (fVar18 < 0.0)))) {
        uVar15 = v_min;
      }
      if ((v_max < uVar15) || (((uVar13 != 8 && (uVar15 < uVar12)) && (0.0 < fVar18)))) {
        uVar15 = v_max;
      }
    }
    if (uVar12 == uVar15) {
      return false;
    }
    *v = uVar15;
    return true;
  }
LAB_0021f60f:
  pIVar9->DragCurrentAccum = 0.0;
  pIVar9->DragCurrentAccumDirty = false;
  return false;
}

Assistant:

bool ImGui::DragBehaviorT(ImGuiDataType data_type, TYPE* v, float v_speed, const TYPE v_min, const TYPE v_max, const char* format, float power, ImGuiDragFlags flags)
{
    ImGuiContext& g = *GImGui;
    const ImGuiAxis axis = (flags & ImGuiDragFlags_Vertical) ? ImGuiAxis_Y : ImGuiAxis_X;
    const bool is_decimal = (data_type == ImGuiDataType_Float) || (data_type == ImGuiDataType_Double);
    const bool is_clamped = (v_min < v_max);
    const bool is_power = (power != 1.0f && is_decimal && is_clamped && (v_max - v_min < FLT_MAX));
    const bool is_locked = (v_min > v_max);
    if (is_locked)
        return false;

    // Default tweak speed
    if (v_speed == 0.0f && is_clamped && (v_max - v_min < FLT_MAX))
        v_speed = (float)((v_max - v_min) * g.DragSpeedDefaultRatio);

    // Inputs accumulates into g.DragCurrentAccum, which is flushed into the current value as soon as it makes a difference with our precision settings
    float adjust_delta = 0.0f;
    if (g.ActiveIdSource == ImGuiInputSource_Mouse && IsMousePosValid() && g.IO.MouseDragMaxDistanceSqr[0] > 1.0f*1.0f)
    {
        adjust_delta = g.IO.MouseDelta[axis];
        if (g.IO.KeyAlt)
            adjust_delta *= 1.0f / 100.0f;
        if (g.IO.KeyShift)
            adjust_delta *= 10.0f;
    }
    else if (g.ActiveIdSource == ImGuiInputSource_Nav)
    {
        int decimal_precision = is_decimal ? ImParseFormatPrecision(format, 3) : 0;
        adjust_delta = GetNavInputAmount2d(ImGuiNavDirSourceFlags_Keyboard | ImGuiNavDirSourceFlags_PadDPad, ImGuiInputReadMode_RepeatFast, 1.0f / 10.0f, 10.0f)[axis];
        v_speed = ImMax(v_speed, GetMinimumStepAtDecimalPrecision(decimal_precision));
    }
    adjust_delta *= v_speed;

    // For vertical drag we currently assume that Up=higher value (like we do with vertical sliders). This may become a parameter.
    if (axis == ImGuiAxis_Y)
        adjust_delta = -adjust_delta;

    // Clear current value on activation
    // Avoid altering values and clamping when we are _already_ past the limits and heading in the same direction, so e.g. if range is 0..255, current value is 300 and we are pushing to the right side, keep the 300.
    bool is_just_activated = g.ActiveIdIsJustActivated;
    bool is_already_past_limits_and_pushing_outward = is_clamped && ((*v >= v_max && adjust_delta > 0.0f) || (*v <= v_min && adjust_delta < 0.0f));
    bool is_drag_direction_change_with_power = is_power && ((adjust_delta < 0 && g.DragCurrentAccum > 0) || (adjust_delta > 0 && g.DragCurrentAccum < 0));
    if (is_just_activated || is_already_past_limits_and_pushing_outward || is_drag_direction_change_with_power)
    {
        g.DragCurrentAccum = 0.0f;
        g.DragCurrentAccumDirty = false;
    }
    else if (adjust_delta != 0.0f)
    {
        g.DragCurrentAccum += adjust_delta;
        g.DragCurrentAccumDirty = true;
    }

    if (!g.DragCurrentAccumDirty)
        return false;

    TYPE v_cur = *v;
    FLOATTYPE v_old_ref_for_accum_remainder = (FLOATTYPE)0.0f;

    if (is_power)
    {
        // Offset + round to user desired precision, with a curve on the v_min..v_max range to get more precision on one side of the range
        FLOATTYPE v_old_norm_curved = ImPow((FLOATTYPE)(v_cur - v_min) / (FLOATTYPE)(v_max - v_min), (FLOATTYPE)1.0f / power);
        FLOATTYPE v_new_norm_curved = v_old_norm_curved + (g.DragCurrentAccum / (v_max - v_min));
        v_cur = v_min + (SIGNEDTYPE)ImPow(ImSaturate((float)v_new_norm_curved), power) * (v_max - v_min);
        v_old_ref_for_accum_remainder = v_old_norm_curved;
    }
    else
    {
        v_cur += (SIGNEDTYPE)g.DragCurrentAccum;
    }

    // Round to user desired precision based on format string
    v_cur = RoundScalarWithFormatT<TYPE, SIGNEDTYPE>(format, data_type, v_cur);

    // Preserve remainder after rounding has been applied. This also allow slow tweaking of values.
    g.DragCurrentAccumDirty = false;
    if (is_power)
    {
        FLOATTYPE v_cur_norm_curved = ImPow((FLOATTYPE)(v_cur - v_min) / (FLOATTYPE)(v_max - v_min), (FLOATTYPE)1.0f / power);
        g.DragCurrentAccum -= (float)(v_cur_norm_curved - v_old_ref_for_accum_remainder);
    }
    else
    {
        g.DragCurrentAccum -= (float)((SIGNEDTYPE)v_cur - (SIGNEDTYPE)*v);
    }

    // Lose zero sign for float/double
    if (v_cur == (TYPE)-0)
        v_cur = (TYPE)0;

    // Clamp values (+ handle overflow/wrap-around for integer types)
    if (*v != v_cur && is_clamped)
    {
        if (v_cur < v_min || (v_cur > *v && adjust_delta < 0.0f && !is_decimal))
            v_cur = v_min;
        if (v_cur > v_max || (v_cur < *v && adjust_delta > 0.0f && !is_decimal))
            v_cur = v_max;
    }

    // Apply result
    if (*v == v_cur)
        return false;
    *v = v_cur;
    return true;
}